

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fft2d.c
# Opt level: O2

void fft3d(float *data,long M3,long M2,long M)

{
  long lVar1;
  ulong uVar2;
  ulong uVar3;
  long lVar4;
  ulong oRsiz;
  long lVar5;
  xdouble *indata;
  bool bVar6;
  ulong local_48;
  
  if (M < 1 || (M2 < 1 || M3 < 1)) {
    lVar4 = M;
    lVar5 = M2;
    if (((M3 == 0) || (lVar5 = M3, M2 == 0)) || (lVar4 = M2, M == 0)) {
      fft2d(data,lVar5,lVar4);
      return;
    }
  }
  else {
    oRsiz = 1L << (M3 & 0x3fU);
    lVar4 = 1L << (M2 & 0x3fU);
    lVar5 = 1L << (M & 0x3fU);
    ffts(data,M,oRsiz << (M2 & 0x3fU));
    uVar3 = M + M2;
    local_48 = ~((long)oRsiz >> 0x3f) & oRsiz;
    if ((ulong)M < 3) {
      lVar1 = 0;
      while (bVar6 = local_48 != 0, local_48 = local_48 - 1, bVar6) {
        dxpose((xdouble *)(data + (lVar1 << (uVar3 & 0x3f))),lVar5,(xdouble *)Array2d[M2],lVar4,
               lVar4,lVar5);
        ffts(Array2d[M2],M2,lVar5);
        dxpose((xdouble *)Array2d[M2],lVar4,(xdouble *)(data + (lVar1 << (uVar3 & 0x3f))),lVar5,
               lVar5,lVar4);
        lVar1 = lVar1 + 2;
      }
    }
    else {
      for (uVar2 = 0; uVar2 != local_48; uVar2 = uVar2 + 1) {
        indata = (xdouble *)(data + (uVar2 * 2 << (uVar3 & 0x3f)));
        for (lVar1 = 0; lVar1 < lVar5; lVar1 = lVar1 + 4) {
          dxpose(indata,lVar5,(xdouble *)Array2d[M2],lVar4,lVar4,4);
          ffts(Array2d[M2],M2,4);
          dxpose((xdouble *)Array2d[M2],lVar4,indata,lVar5,4,lVar4);
          indata = indata + 4;
        }
      }
    }
    if ((long)uVar3 < 3) {
      dxpose((xdouble *)data,4,(xdouble *)Array2d[M3],oRsiz,oRsiz,4);
      ffts(Array2d[M3],M3,4);
      dxpose((xdouble *)Array2d[M3],oRsiz,(xdouble *)data,4,4,oRsiz);
      return;
    }
    uVar3 = 1L << (uVar3 & 0x3f);
    for (uVar2 = 0; uVar2 < uVar3; uVar2 = uVar2 + 4) {
      dxpose((xdouble *)data,uVar3,(xdouble *)Array2d[M3],oRsiz,oRsiz,4);
      ffts(Array2d[M3],M3,4);
      dxpose((xdouble *)Array2d[M3],oRsiz,(xdouble *)data,uVar3,4,oRsiz);
      data = (float *)((long)data + 0x20);
    }
  }
  return;
}

Assistant:

void fft3d(float *data, long M3, long M2, long M){
/* Compute 2D complex fft and return results in-place	*/
/* INPUTS */
/* *data = input data array	*/
/* M3 = log2 of fft size number of pages */
/* M2 = log2 of fft size number of rows */
/* M = log2 of fft size number of columns */
/* OUTPUTS */
/* *data = output data array	*/
long i1;
long i2;
const long N = POW2(M);
const long N2 = POW2(M2);
const long N3 = POW2(M3);
if((M3>0)&&(M2>0)&&(M>0)){
	ffts(data, M, N3*N2);
	if (M>2)
		for (i2=0; i2<N3; i2++){
			for (i1=0; i1<N; i1+=4){
				cxpose(data + i2*2*POW2(M2+M) + i1*2, N, Array2d[M2], N2, N2, 4);
				ffts(Array2d[M2], M2, 4);
				cxpose(Array2d[M2], N2, data + i2*2*POW2(M2+M) + i1*2, N, 4, N2);
			}
		}
	else{
		for (i2=0; i2<N3; i2++){
			cxpose(data + i2*2*POW2(M2+M), N, Array2d[M2], N2, N2, N);
			ffts(Array2d[M2], M2, N);
			cxpose(Array2d[M2], N2, data + i2*2*POW2(M2+M), N, N, N2);
		}
	}
	if ((M2+M)>2)
		for (i1=0; i1<POW2(M2+M); i1+=4){
			cxpose(data + i1*2, POW2(M2+M), Array2d[M3], N3, N3, 4);
			ffts(Array2d[M3], M3, 4);
			cxpose(Array2d[M3], N3, data + i1*2, POW2(M2+M), 4, N3);
		}
	else{
		cxpose(data, POW2(M2+M), Array2d[M3], N3, N3, POW2(M2+M));
		ffts(Array2d[M3], M3, POW2(M2+M));
		cxpose(Array2d[M3], N3, data, POW2(M2+M), POW2(M2+M), N3);
	}
}
else
	if(M3==0) fft2d(data, M2, M);
	else
		if(M2==0) fft2d(data, M3, M);
		else
			if(M==0) fft2d(data, M3, M2);
}